

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void set_data_type(deflate_state *s)

{
  int local_14;
  int n;
  deflate_state *s_local;
  
  local_14 = 0;
  while ((local_14 < 9 && (s->dyn_ltree[local_14].fc.freq == 0))) {
    local_14 = local_14 + 1;
  }
  if (local_14 == 9) {
    local_14 = 0xe;
    while ((local_14 < 0x20 && (s->dyn_ltree[local_14].fc.freq == 0))) {
      local_14 = local_14 + 1;
    }
  }
  s->strm->data_type = (uint)(local_14 == 0x20);
  return;
}

Assistant:

local void set_data_type(s)
    deflate_state *s;
{
    int n;

    for (n = 0; n < 9; n++)
        if (s->dyn_ltree[n].Freq != 0)
            break;
    if (n == 9)
        for (n = 14; n < 32; n++)
            if (s->dyn_ltree[n].Freq != 0)
                break;
    s->strm->data_type = (n == 32) ? Z_TEXT : Z_BINARY;
}